

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileImporter::~ObjFileImporter(ObjFileImporter *this)

{
  Object *this_00;
  ObjFileImporter *this_local;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_01042c10;
  this_00 = this->m_pRootObject;
  if (this_00 != (Object *)0x0) {
    ObjFile::Object::~Object(this_00);
    operator_delete(this_00);
  }
  this->m_pRootObject = (Object *)0x0;
  std::__cxx11::string::~string((string *)&this->m_strAbsPath);
  std::vector<char,_std::allocator<char>_>::~vector(&this->m_Buffer);
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

ObjFileImporter::~ObjFileImporter() {
    delete m_pRootObject;
    m_pRootObject = nullptr;
}